

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

ZSTD_CCtx_params * ZSTD_createCCtxParams(void)

{
  ZSTD_customMem customMem;
  ZSTD_CCtx_params *__s;
  
  customMem.opaque = (void *)0x0;
  customMem.customAlloc = (ZSTD_allocFunction)0x0;
  customMem.customFree = (ZSTD_freeFunction)0x0;
  __s = (ZSTD_CCtx_params *)ZSTD_customCalloc(0xb0,customMem);
  if (__s == (ZSTD_CCtx_params *)0x0) {
    __s = (ZSTD_CCtx_params *)0x0;
  }
  else {
    memset(__s,0,0xb0);
    __s->compressionLevel = 3;
    (__s->fParams).contentSizeFlag = 1;
    (__s->customMem).customAlloc = (ZSTD_allocFunction)0x0;
    (__s->customMem).customFree = (ZSTD_freeFunction)0x0;
    (__s->customMem).opaque = (void *)0x0;
  }
  return __s;
}

Assistant:

static ZSTD_CCtx_params* ZSTD_createCCtxParams_advanced(
        ZSTD_customMem customMem)
{
    ZSTD_CCtx_params* params;
    if ((!customMem.customAlloc) ^ (!customMem.customFree)) return NULL;
    params = (ZSTD_CCtx_params*)ZSTD_customCalloc(
            sizeof(ZSTD_CCtx_params), customMem);
    if (!params) { return NULL; }
    ZSTD_CCtxParams_init(params, ZSTD_CLEVEL_DEFAULT);
    params->customMem = customMem;
    return params;
}